

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxMaterial::Read(PmxMaterial *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  uint8_t in_CL;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->material_english_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::istream::read((char *)stream,(long)this->diffuse);
  std::istream::read((char *)stream,(long)this->specular);
  std::istream::read((char *)stream,(long)&this->specularlity);
  std::istream::read((char *)stream,(long)this->ambient);
  std::istream::read((char *)stream,(long)&this->flag);
  std::istream::read((char *)stream,(long)this->edge_color);
  std::istream::read((char *)stream,(long)&this->edge_size);
  iVar1 = ReadIndex(stream,(uint)setting->texture_index_size);
  this->diffuse_texture_index = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->texture_index_size);
  this->sphere_texture_index = iVar1;
  std::istream::read((char *)stream,(long)&this->sphere_op_mode);
  std::istream::read((char *)stream,(long)&this->common_toon_flag);
  if (this->common_toon_flag == '\0') {
    iVar1 = ReadIndex(stream,(uint)setting->texture_index_size);
    this->toon_texture_index = iVar1;
  }
  else {
    std::istream::read((char *)stream,(long)&this->toon_texture_index);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->memo,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::istream::read((char *)stream,(long)&this->index_count);
  return;
}

Assistant:

void PmxMaterial::Read(std::istream *stream, PmxSetting *setting)
	{
		this->material_name = ReadString(stream, setting->encoding);
		this->material_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) this->diffuse, sizeof(float) * 4);
		stream->read((char*) this->specular, sizeof(float) * 3);
		stream->read((char*) &this->specularlity, sizeof(float));
		stream->read((char*) this->ambient, sizeof(float) * 3);
		stream->read((char*) &this->flag, sizeof(uint8_t));
		stream->read((char*) this->edge_color, sizeof(float) * 4);
		stream->read((char*) &this->edge_size, sizeof(float));
		this->diffuse_texture_index = ReadIndex(stream, setting->texture_index_size);
		this->sphere_texture_index = ReadIndex(stream, setting->texture_index_size);
		stream->read((char*) &this->sphere_op_mode, sizeof(uint8_t));
		stream->read((char*) &this->common_toon_flag, sizeof(uint8_t));
		if (this->common_toon_flag)
		{
			stream->read((char*) &this->toon_texture_index, sizeof(uint8_t));
		}
		else {
			this->toon_texture_index = ReadIndex(stream, setting->texture_index_size);
		}
		this->memo = ReadString(stream, setting->encoding);
		stream->read((char*) &this->index_count, sizeof(int));
	}